

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O3

uint32_t * FastPForLib::__fastpackwithoutmask10_8(uint32_t *in,uint32_t *out)

{
  uint uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  
  uVar1 = in[3];
  uVar2 = in[5];
  uVar3 = in[4];
  *out = uVar1 << 0x1e | in[2] << 0x14 | in[1] << 10 | *in;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = *(ulong *)(in + 6);
  auVar4 = vpsllvd_avx2(auVar5,_DAT_001a4020);
  auVar5 = vpinsrd_avx(ZEXT416(uVar2 << 0x12 | uVar3 << 8 | uVar1 >> 2),
                       (uint)(*(ulong *)(in + 6) >> 4) & 0xfffffff,1);
  auVar5 = vpor_avx(auVar4,auVar5);
  *(long *)(out + 1) = auVar5._0_8_;
  return out + 3;
}

Assistant:

uint32_t *__fastpackwithoutmask10_8(const uint32_t *__restrict__ in,
                                    uint32_t *__restrict__ out) {

  *out = (*in);
  ++in;
  *out |= ((*in)) << 10;
  ++in;
  *out |= ((*in)) << 20;
  ++in;
  *out |= ((*in)) << 30;
  ++out;
  *out = ((*in)) >> (10 - 8);
  ++in;
  *out |= ((*in)) << 8;
  ++in;
  *out |= ((*in)) << 18;
  ++in;
  *out |= ((*in)) << 28;
  ++out;
  *out = ((*in)) >> (10 - 6);
  ++in;
  *out |= ((*in)) << 6;
  ++in;

  return out + 1;
}